

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpData.cc
# Opt level: O3

void __thiscall tt::net::HttpData::reset(HttpData *this)

{
  weak_ptr<tt::net::TimerNode> *this_00;
  int iVar1;
  element_type *peVar2;
  _Atomic_word _Var3;
  int iVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar5;
  
  (this->fileName_)._M_string_length = 0;
  *(this->fileName_)._M_dataplus._M_p = '\0';
  (this->path_)._M_string_length = 0;
  *(this->path_)._M_dataplus._M_p = '\0';
  this->nowReadPos_ = 0;
  this->state_ = STATE_PARSE_URI;
  this->hState_ = H_START;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->headers_)._M_t);
  this_01 = (this->timer_).super___weak_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    return;
  }
  this_00 = &this->timer_;
  _Var3 = this_01->_M_use_count;
  do {
    if (_Var3 == 0) {
      return;
    }
    LOCK();
    iVar4 = this_01->_M_use_count;
    bVar5 = _Var3 == iVar4;
    if (bVar5) {
      this_01->_M_use_count = _Var3 + 1;
      iVar4 = _Var3;
    }
    _Var3 = iVar4;
    UNLOCK();
  } while (!bVar5);
  if (this_01->_M_use_count != 0) {
    peVar2 = (this_00->super___weak_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    if (peVar2 == (element_type *)0x0) {
      return;
    }
    this_01 = (this->timer_).super___weak_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    iVar4 = this_01->_M_use_count;
    do {
      LOCK();
      iVar1 = this_01->_M_use_count;
      bVar5 = iVar4 == iVar1;
      if (bVar5) {
        this_01->_M_use_count = iVar4 + 1;
        iVar1 = iVar4;
      }
      iVar4 = iVar1;
      UNLOCK();
    } while (!bVar5);
    TimerNode::clearReq((this_00->super___weak_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr);
    std::__weak_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2>::reset
              (&this_00->super___weak_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2>);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  return;
}

Assistant:

void HttpData::reset() {
  // inBuffer_.clear();
  fileName_.clear();
  path_.clear();
  nowReadPos_ = 0;
  state_ = STATE_PARSE_URI;
  hState_ = H_START;
  headers_.clear();
  // keepAlive_ = false;
  if (timer_.lock()) {
	  std::shared_ptr<TimerNode> my_timer(timer_.lock());
    my_timer->clearReq();
    timer_.reset();
  }
}